

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

string * __thiscall
flatbuffers::BinaryAnnotator::BuildUnion_abi_cxx11_
          (string *__return_storage_ptr__,BinaryAnnotator *this,uint64_t union_offset,
          uint8_t realized_type,Field *field)

{
  bool bVar1;
  BaseType BVar2;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *this_00;
  Type *pTVar3;
  char *pcVar4;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *this_01;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_02;
  char *pcVar5;
  String *pSVar6;
  int __c;
  int __c_00;
  BinaryAnnotator *__s;
  allocator<char> local_169;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_168;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  BinarySection local_e8;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [8];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  Object *object;
  Type *union_type;
  allocator<char> local_41;
  EnumVal *local_40;
  EnumVal *enum_val;
  Enum *next_enum;
  Field *field_local;
  char *pcStack_20;
  uint8_t realized_type_local;
  uint64_t union_offset_local;
  BinaryAnnotator *this_local;
  
  __s = this;
  next_enum = (Enum *)field;
  field_local._7_1_ = realized_type;
  pcStack_20 = (char *)union_offset;
  union_offset_local = (uint64_t)this;
  this_local = (BinaryAnnotator *)__return_storage_ptr__;
  this_00 = reflection::Schema::enums(this->schema_);
  pTVar3 = reflection::Field::type((Field *)next_enum);
  pcVar4 = reflection::Type::index(pTVar3,(char *)__s,__c);
  enum_val = (EnumVal *)
             Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::Get(this_00,(uint)pcVar4);
  this_01 = reflection::Enum::values((Enum *)enum_val);
  local_40 = Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::Get
                       (this_01,(uint)field_local._7_1_);
  pcVar4 = pcStack_20;
  bVar1 = ContainsSection(this,(uint64_t)pcStack_20);
  if (bVar1) {
    pSVar6 = reflection::EnumVal::name(local_40);
    pcVar4 = String::c_str(pSVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar4,&local_41);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    pTVar3 = reflection::EnumVal::union_type(local_40);
    BVar2 = reflection::Type::base_type(pTVar3);
    if (BVar2 == Obj) {
      this_02 = reflection::Schema::objects(this->schema_);
      pcVar4 = reflection::Type::index(pTVar3,pcVar4,__c_00);
      regions.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                              (this_02,(uint)pcVar4);
      bVar1 = reflection::Object::is_struct
                        ((Object *)
                         regions.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
                  ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                   local_80);
        pcVar4 = pcStack_20;
        pSVar6 = reflection::Field::name((Field *)next_enum);
        pcVar5 = String::c_str(pSVar6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar5,&local_a1);
        BuildStruct(this,(uint64_t)pcVar4,
                    (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *
                    )local_80,&local_a0,
                    (Object *)
                    regions.
                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
        pcVar4 = pcStack_20;
        pSVar6 = reflection::Object::name
                           ((Object *)
                            regions.
                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar5 = String::c_str(pSVar6);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar5,&local_149);
        std::operator+(&local_128,&local_148,".");
        pSVar6 = reflection::Field::name((Field *)next_enum);
        pcVar5 = String::c_str(pSVar6);
        std::operator+(&local_108,&local_128,pcVar5);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
                  (&local_168,
                   (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                   local_80);
        anon_unknown_46::MakeBinarySection(&local_e8,&local_108,Union,&local_168);
        AddSection(this,(uint64_t)pcVar4,&local_e8);
        BinarySection::~BinarySection(&local_e8);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_168);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator(&local_149);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                   local_80);
      }
      else {
        BuildTable(this,(uint64_t)pcStack_20,Table,
                   (Object *)
                   regions.
                   super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    pSVar6 = reflection::EnumVal::name(local_40);
    pcVar4 = String::c_str(pSVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar4,&local_169);
    std::allocator<char>::~allocator(&local_169);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryAnnotator::BuildUnion(const uint64_t union_offset,
                                        const uint8_t realized_type,
                                        const reflection::Field *const field) {
  const reflection::Enum *next_enum =
      schema_->enums()->Get(field->type()->index());

  const reflection::EnumVal *enum_val = next_enum->values()->Get(realized_type);

  if (ContainsSection(union_offset)) { return enum_val->name()->c_str(); }

  const reflection::Type *union_type = enum_val->union_type();

  if (union_type->base_type() == reflection::BaseType::Obj) {
    const reflection::Object *object =
        schema_->objects()->Get(union_type->index());

    if (object->is_struct()) {
      // Union of vectors point to a new Binary section
      std::vector<BinaryRegion> regions;

      BuildStruct(union_offset, regions, field->name()->c_str(), object);

      AddSection(
          union_offset,
          MakeBinarySection(std::string(object->name()->c_str()) + "." +
                                field->name()->c_str(),
                            BinarySectionType::Union, std::move(regions)));
    } else {
      BuildTable(union_offset, BinarySectionType::Table, object);
    }
  }
  // TODO(dbaileychess): handle the other union types.

  return enum_val->name()->c_str();
}